

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O0

WebPInfoStatus ParseRIFFHeader(WebPInfo *webp_info,MemBuffer *mem)

{
  uint32_t uVar1;
  size_t sVar2;
  int *piVar3;
  uint8_t *puVar4;
  ulong uVar5;
  MemBuffer *in_RSI;
  long in_RDI;
  size_t riff_size;
  size_t min_size;
  uint8_t *data;
  WebPInfoStatus local_4;
  
  data = (uint8_t *)0x14;
  sVar2 = MemDataSize(in_RSI);
  if (sVar2 < 0x14) {
    if (*(int *)(in_RDI + 0x70) != 0) {
      fprintf(_stderr,"Error: %s\n","Truncated data detected when parsing RIFF header.");
    }
    local_4 = WEBP_INFO_TRUNCATED_DATA;
  }
  else {
    piVar3 = (int *)GetBuffer(in_RSI);
    if ((*piVar3 == 0x46464952) && (puVar4 = GetBuffer(in_RSI), *(int *)(puVar4 + 8) == 0x50424557))
    {
      GetBuffer(in_RSI);
      uVar1 = GetLE32(data);
      uVar5 = (ulong)uVar1;
      if (uVar5 < 8) {
        if (*(int *)(in_RDI + 0x70) != 0) {
          fprintf(_stderr,"Error: %s\n","RIFF size is too small.");
        }
        local_4 = WEBP_INFO_PARSE_ERROR;
      }
      else if (uVar5 < 0xfffffff7) {
        uVar5 = uVar5 + 8;
        if (*(int *)(in_RDI + 0x6c) == 0) {
          printf("RIFF HEADER:\n");
          printf("  File size: %6d\n",uVar5 & 0xffffffff);
        }
        if (uVar5 < in_RSI->end_) {
          if (*(int *)(in_RDI + 0x70) != 0) {
            fprintf(_stderr,"Warning: %s\n","RIFF size is smaller than the file size.");
          }
          *(int *)(in_RDI + 0x78) = *(int *)(in_RDI + 0x78) + 1;
          in_RSI->end_ = uVar5;
        }
        else if (in_RSI->end_ < uVar5) {
          if (*(int *)(in_RDI + 0x70) != 0) {
            fprintf(_stderr,"Error: %s\n","Truncated data detected when parsing RIFF payload.");
          }
          return WEBP_INFO_TRUNCATED_DATA;
        }
        Skip(in_RSI,0xc);
        local_4 = WEBP_INFO_OK;
      }
      else {
        if (*(int *)(in_RDI + 0x70) != 0) {
          fprintf(_stderr,"Error: %s\n","RIFF size is over limit.");
        }
        local_4 = WEBP_INFO_PARSE_ERROR;
      }
    }
    else {
      if (*(int *)(in_RDI + 0x70) != 0) {
        fprintf(_stderr,"Error: %s\n","Corrupted RIFF header.");
      }
      local_4 = WEBP_INFO_PARSE_ERROR;
    }
  }
  return local_4;
}

Assistant:

static WebPInfoStatus ParseRIFFHeader(WebPInfo* const webp_info,
                                      MemBuffer* const mem) {
  const size_t min_size = RIFF_HEADER_SIZE + CHUNK_HEADER_SIZE;
  size_t riff_size;

  if (MemDataSize(mem) < min_size) {
    LOG_ERROR("Truncated data detected when parsing RIFF header.");
    return WEBP_INFO_TRUNCATED_DATA;
  }
  if (memcmp(GetBuffer(mem), "RIFF", CHUNK_SIZE_BYTES) ||
      memcmp(GetBuffer(mem) + CHUNK_HEADER_SIZE, "WEBP", CHUNK_SIZE_BYTES)) {
    LOG_ERROR("Corrupted RIFF header.");
    return WEBP_INFO_PARSE_ERROR;
  }
  riff_size = GetLE32(GetBuffer(mem) + TAG_SIZE);
  if (riff_size < CHUNK_HEADER_SIZE) {
    LOG_ERROR("RIFF size is too small.");
    return WEBP_INFO_PARSE_ERROR;
  }
  if (riff_size > MAX_CHUNK_PAYLOAD) {
    LOG_ERROR("RIFF size is over limit.");
    return WEBP_INFO_PARSE_ERROR;
  }
  riff_size += CHUNK_HEADER_SIZE;
  if (!webp_info->quiet_) {
    printf("RIFF HEADER:\n");
    printf("  File size: %6d\n", (int)riff_size);
  }
  if (riff_size < mem->end_) {
    LOG_WARN("RIFF size is smaller than the file size.");
    mem->end_ = riff_size;
  } else if (riff_size > mem->end_) {
    LOG_ERROR("Truncated data detected when parsing RIFF payload.");
    return WEBP_INFO_TRUNCATED_DATA;
  }
  Skip(mem, RIFF_HEADER_SIZE);
  return WEBP_INFO_OK;
}